

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(SequentialAnchorData *this)

{
  AnchorData **ppAVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  AnchorVertex **ppAVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  ppAVar5 = &(this->super_AnchorData).from;
  dVar6 = 0.0;
  dVar7 = 0.0;
  (this->super_AnchorData).maxSize = 0.0;
  (this->super_AnchorData).minPrefSize = 0.0;
  (this->super_AnchorData).maxPrefSize = 0.0;
  (this->super_AnchorData).minSize = 0.0;
  (this->super_AnchorData).prefSize = 0.0;
  ppAVar1 = (this->m_edges).d.ptr;
  lVar2 = (this->m_edges).d.size;
  dVar8 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    lVar3 = *(long *)((long)ppAVar1 + lVar4);
    if (*(AnchorVertex **)(lVar3 + 0x18) == *ppAVar5) {
      dVar10 = dVar10 + *(double *)(lVar3 + 0x28);
      (this->super_AnchorData).minSize = dVar10;
      dVar6 = dVar6 + *(double *)(lVar3 + 0x30);
      dVar7 = dVar7 + *(double *)(lVar3 + 0x38);
      dVar9 = dVar9 + *(double *)(lVar3 + 0x40);
      (this->super_AnchorData).minPrefSize = dVar9;
      dVar8 = dVar8 + *(double *)(lVar3 + 0x48);
      ppAVar5 = (AnchorVertex **)(lVar3 + 0x20);
    }
    else {
      ppAVar5 = (AnchorVertex **)(lVar3 + 0x18);
      dVar10 = dVar10 - *(double *)(lVar3 + 0x38);
      (this->super_AnchorData).minSize = dVar10;
      dVar9 = dVar9 - *(double *)(lVar3 + 0x48);
      dVar6 = dVar6 - *(double *)(lVar3 + 0x30);
      dVar7 = dVar7 - *(double *)(lVar3 + 0x28);
      (this->super_AnchorData).minPrefSize = dVar9;
      dVar8 = dVar8 - *(double *)(lVar3 + 0x40);
    }
    (this->super_AnchorData).prefSize = dVar6;
    (this->super_AnchorData).maxSize = dVar7;
    (this->super_AnchorData).maxPrefSize = dVar8;
  }
  (this->super_AnchorData).sizeAtMinimum = dVar6;
  (this->super_AnchorData).sizeAtPreferred = dVar6;
  (this->super_AnchorData).sizeAtMaximum = dVar6;
  return;
}

Assistant:

void SequentialAnchorData::calculateSizeHints()
{
    minSize = 0;
    prefSize = 0;
    maxSize = 0;
    minPrefSize = 0;
    maxPrefSize = 0;

    AnchorVertex *prev = from;

    for (AnchorData *edge : m_edges) {
        const bool edgeIsForward = (edge->from == prev);
        if (edgeIsForward) {
            minSize += edge->minSize;
            prefSize += edge->prefSize;
            maxSize += edge->maxSize;
            minPrefSize += edge->minPrefSize;
            maxPrefSize += edge->maxPrefSize;
            prev = edge->to;
        } else {
            Q_ASSERT(prev == edge->to);
            minSize -= edge->maxSize;
            prefSize -= edge->prefSize;
            maxSize -= edge->minSize;
            minPrefSize -= edge->maxPrefSize;
            maxPrefSize -= edge->minPrefSize;
            prev = edge->from;
        }
    }

    // See comment in AnchorData::refreshSizeHints() about sizeAt* values
    sizeAtMinimum = prefSize;
    sizeAtPreferred = prefSize;
    sizeAtMaximum = prefSize;
}